

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaturalLogarithmExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::NaturalLogarithmExpression::derivative
          (NaturalLogarithmExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Expression *in_RDI;
  BaseExpressionPtr BVar2;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000010;
  int *in_stack_00000018;
  Expression *arg;
  undefined1 local_60 [20];
  undefined4 local_4c;
  undefined8 local_18;
  
  local_4c = 1;
  arg = in_RDI;
  local_18 = in_RDX;
  operator/<int,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_00000018,in_stack_00000010);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x122a34);
  (*peVar1->_vptr_BaseExpression[1])(local_60,peVar1,local_18);
  operator*<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((Expression *)this,(shared_ptr<Kandinsky::BaseExpression> *)variable);
  BaseExpression::makePtr<Kandinsky::Expression>(arg);
  Expression::~Expression((Expression *)0x122a7c);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x122a86);
  Expression::~Expression((Expression *)0x122a90);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr NaturalLogarithmExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(1 / m_arg * m_arg->derivative(variable));
    }